

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_queued.c
# Opt level: O0

void libpd_queued_receive_midi_messages(void)

{
  anon_enum_32 *paVar1;
  midi_params *p_00;
  int len;
  midi_params *pmVar2;
  midi_params *p;
  char *buffer;
  char *end;
  size_t available;
  queued_stuff *queued;
  
  available = (size_t)libpd_mainimp.i_queued;
  len = rb_available_to_read(*(ring_buffer **)((long)libpd_mainimp.i_queued + 0x78));
  end = (char *)(long)len;
  if (end != (char *)0x0) {
    rb_read_from_buffer(*(ring_buffer **)(available + 0x78),(char *)(available + 0x80),len);
    buffer = end + available + 0x80;
    p = (midi_params *)(available + 0x80);
    while (p_00 = p, p < buffer) {
      pmVar2 = p + 1;
      paVar1 = &p->type;
      p = pmVar2;
      switch(*paVar1) {
      case LIBPD_NOTEON:
        receive_noteon(p_00,(char **)&p);
        break;
      case LIBPD_CONTROLCHANGE:
        receive_controlchange(p_00,(char **)&p);
        break;
      case LIBPD_PROGRAMCHANGE:
        receive_programchange(p_00,(char **)&p);
        break;
      case LIBPD_PITCHBEND:
        receive_pitchbend(p_00,(char **)&p);
        break;
      case LIBPD_AFTERTOUCH:
        receive_aftertouch(p_00,(char **)&p);
        break;
      case LIBPD_POLYAFTERTOUCH:
        receive_polyaftertouch(p_00,(char **)&p);
        break;
      case LIBPD_MIDIBYTE:
        receive_midibyte(p_00,(char **)&p);
      }
    }
  }
  return;
}

Assistant:

void libpd_queued_receive_midi_messages() {
  queued_stuff *queued = QUEUEDSTUFF;
  size_t available = rb_available_to_read(queued->midi_receive_buffer);
  if (!available) return;
  rb_read_from_buffer(queued->midi_receive_buffer, queued->temp_buffer, (int)available);
  char *end = queued->temp_buffer + available;
  char *buffer = queued->temp_buffer;
  while (buffer < end) {
    midi_params *p = (midi_params *)buffer;
    buffer += S_MIDI_PARAMS;
    switch (p->type) {
      case LIBPD_NOTEON: {
        receive_noteon(p, &buffer);
        break;
      }
      case LIBPD_CONTROLCHANGE: {
        receive_controlchange(p, &buffer);
        break;
      }
      case LIBPD_PROGRAMCHANGE: {
        receive_programchange(p, &buffer);
        break;
      }
      case LIBPD_PITCHBEND: {
        receive_pitchbend(p, &buffer);
        break;
      }
      case LIBPD_AFTERTOUCH: {
        receive_aftertouch(p, &buffer);
        break;
      }
      case LIBPD_POLYAFTERTOUCH: {
        receive_polyaftertouch(p, &buffer);
        break;
      }
      case LIBPD_MIDIBYTE: {
        receive_midibyte(p, &buffer);
        break;
      }
      default:
        break;
    }
  }
}